

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  this->m_runState = Failed;
  if (this->m_parent != (ITracker *)0x0) {
    (*(this->m_parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[0xc])();
  }
  moveToParent(this);
  this->m_ctx->m_runState = CompletedCycle;
  return;
}

Assistant:

virtual void fail() CATCH_OVERRIDE {
            m_runState = Failed;
            if( m_parent )
                m_parent->markAsNeedingAnotherRun();
            moveToParent();
            m_ctx.completeCycle();
        }